

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

void test_fast_strcpy(void)

{
  char dest [32];
  char local_38 [40];
  
  local_38[0x10] = '\0';
  local_38[0x11] = '\0';
  local_38[0x12] = '\0';
  local_38[0x13] = '\0';
  local_38[0x14] = '\0';
  local_38[0x15] = '\0';
  local_38[0x16] = '\0';
  local_38[0x17] = '\0';
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_38[8] = '\0';
  local_38[9] = '\0';
  local_38[10] = '\0';
  local_38[0xb] = '\0';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = '\0';
  local_38[0x18] = 'x';
  local_38[0x19] = '\0';
  local_38[0x1a] = '\0';
  local_38[0x1b] = '\0';
  local_38[0x1c] = '\0';
  local_38[0x1d] = '\0';
  local_38[0x1e] = '\0';
  local_38[0x1f] = '\0';
  fast_strcpy(local_38,"rtosc is a good library",0x20);
  assert_str_eq("rtosc is a good library",local_38,"fast_strcpy() copies at most <strlen> bytes",0xd
               );
  fast_strcpy(local_38,"rtosc is a good library",0x20);
  assert_char_eq('x',local_38[0x18],"fast_strcpy() does not pad the dest with zeros",0x11);
  fast_strcpy(local_38,"rtosc is a good library",6);
  assert_str_eq("rtosc",local_38,"fast_strcpy() copies at most <buffersize> bytes",0x15);
  return;
}

Assistant:

void test_fast_strcpy()
{
    const char* src = "rtosc is a good library";
    char dest[32];
    memset(dest, 0, sizeof(dest));
    dest[strlen(src)+1] = 'x';

    fast_strcpy(dest, src, 32);
    assert_str_eq(src, dest,
                  "fast_strcpy() copies at most <strlen> bytes", __LINE__);

    fast_strcpy(dest, src, 32);
    assert_char_eq('x', dest[strlen(src)+1],
                  "fast_strcpy() does not pad the dest with zeros", __LINE__);

    fast_strcpy(dest, src, 6);
    assert_str_eq("rtosc", dest,
                  "fast_strcpy() copies at most <buffersize> bytes", __LINE__);
}